

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Register.c
# Opt level: O2

ZydisRegisterWidth ZydisRegisterGetWidth(ZydisMachineMode mode,ZydisRegister reg)

{
  if (ZYDIS_REGISTER_IA32_KERNEL_GS_BASE < reg) {
    return 0;
  }
  return *(ZydisRegisterWidth *)
          ((ulong)reg * 0xc + 0x1200f6 + (ulong)(mode == ZYDIS_MACHINE_MODE_LONG_64) * 2);
}

Assistant:

ZydisRegisterWidth ZydisRegisterGetWidth(ZydisMachineMode mode, ZydisRegister reg)
{
    if ((ZyanUSize)reg >= ZYAN_ARRAY_LENGTH(REG_LOOKUP))
    {
        return 0;
    }

    return (mode == ZYDIS_MACHINE_MODE_LONG_64)
        ? REG_LOOKUP[reg].width64
        : REG_LOOKUP[reg].width;
}